

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmenu.cpp
# Opt level: O1

void __thiscall FListMenuItemStaticText::Drawer(FListMenuItemStaticText *this,bool selected)

{
  int iVar1;
  BYTE *string;
  EColorRange normalcolor;
  int x;
  int x_00;
  FFont *font;
  int tag_first;
  
  string = (BYTE *)this->mText;
  if (string != (BYTE *)0x0) {
    if (*string == '$') {
      string = (BYTE *)FStringTable::operator()(&GStrings,(char *)(string + 1));
    }
    x_00 = (this->super_FListMenuItem).mXpos;
    if ((this->super_FListMenuItem).mYpos < 0) {
      x_00 = ((screen->super_DSimpleCanvas).super_DCanvas.Width >> 1) + (x_00 + -0xa0) * CleanXfac;
      if (this->mCentered == true) {
        iVar1 = FFont::StringWidth(this->mFont,string);
        x_00 = x_00 - (iVar1 * CleanXfac) / 2;
      }
      font = this->mFont;
      normalcolor = this->mColor;
      iVar1 = -((this->super_FListMenuItem).mYpos * CleanYfac);
      tag_first = 0x40001393;
    }
    else {
      if (this->mCentered == true) {
        iVar1 = FFont::StringWidth(this->mFont,string);
        x_00 = x_00 - iVar1 / 2;
      }
      font = this->mFont;
      normalcolor = this->mColor;
      iVar1 = (this->super_FListMenuItem).mYpos;
      tag_first = 0x40001390;
    }
    DCanvas::DrawText((DCanvas *)screen,font,normalcolor,x_00,iVar1,(char *)string,tag_first,1,0);
  }
  return;
}

Assistant:

void FListMenuItemStaticText::Drawer(bool selected)
{
	const char *text = mText;
	if (text != NULL)
	{
		if (*text == '$') text = GStrings(text+1);
		if (mYpos >= 0)
		{
			int x = mXpos;
			if (mCentered) x -= mFont->StringWidth(text)/2;
			screen->DrawText(mFont, mColor, x, mYpos, text, DTA_Clean, true, TAG_DONE);
		}
		else
		{
			int x = (mXpos - 160) * CleanXfac + (SCREENWIDTH>>1);
			if (mCentered) x -= (mFont->StringWidth(text)*CleanXfac)/2;
			screen->DrawText (mFont, mColor, x, -mYpos*CleanYfac, text, DTA_CleanNoMove, true, TAG_DONE);
		}
	}
}